

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::buffer_is_packing_standard
          (CompilerGLSL *this,SPIRType *type,BufferPackingStandard packing,
          uint32_t *failed_validation_index,uint32_t start_offset,uint32_t end_offset)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  SPIRType *type_00;
  Meta *pMVar6;
  uint uVar7;
  BufferPackingStandard packing_00;
  uint index;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  bool local_ca;
  Bitset local_78;
  
  bVar1 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock);
  local_ca = true;
  if (!bVar1) {
    local_ca = Compiler::has_decoration
                         (&this->super_Compiler,(ID)(type->super_IVariant).self.id,
                          DecorationBufferBlock);
  }
  uVar7 = packing - BufferPackingStd140EnhancedLayout;
  index = 0;
  uVar8 = 1;
  uVar11 = 0;
  do {
    uVar12 = (ulong)index;
    if ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size <= uVar12) {
      iVar9 = 2;
      break;
    }
    type_00 = Compiler::get<spirv_cross::SPIRType>
                        (&this->super_Compiler,
                         (type->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar12].
                         id);
    pMVar6 = ParsedIR::find_meta(&(this->super_Compiler).ir,(ID)(type->super_IVariant).self.id);
    if (pMVar6 == (Meta *)0x0) {
      local_78.lower = 0;
      local_78.higher._M_h._M_buckets = &local_78.higher._M_h._M_single_bucket;
      local_78.higher._M_h._M_bucket_count = 1;
      local_78.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_78.higher._M_h._M_element_count = 0;
      local_78.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_78.higher._M_h._M_rehash_policy._4_4_ = 0;
      local_78.higher._M_h._M_rehash_policy._M_next_resize = 0;
      local_78.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
    }
    else {
      Bitset::Bitset(&local_78,
                     &(pMVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[uVar12].
                      decoration_flags);
    }
    uVar2 = type_to_packed_alignment(this,type_00,&local_78,packing);
    if ((((local_ca == false) ||
         ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size != (ulong)(index + 1))) ||
        ((packing & ~BufferPackingStd430) == BufferPackingHLSLCbuffer)) ||
       (uVar3 = 0, (type_00->array).super_VectorView<unsigned_int>.buffer_size == 0)) {
      uVar3 = type_to_packed_size(this,type_00,&local_78,packing);
    }
    uVar4 = Compiler::type_struct_member_offset(&this->super_Compiler,type,index);
    if ((packing & ~BufferPackingStd430) == BufferPackingHLSLCbuffer) {
      uVar5 = uVar4;
      if (packing == BufferPackingHLSLCbuffer) {
        uVar5 = uVar11;
      }
      if ((0xf < ((uVar3 + uVar5) - 1 ^ uVar5)) && (uVar2 < 0x11)) {
        uVar2 = 0x10;
      }
    }
    if (uVar4 < end_offset) {
      uVar10 = uVar8;
      if (uVar8 < uVar2) {
        uVar10 = uVar2;
      }
      if ((type_00->pointer & 1U) != 0) {
        uVar2 = 1;
      }
      uVar8 = uVar2;
      if (type_00->basetype != Struct) {
        uVar8 = 1;
      }
      if (start_offset <= uVar4) {
        uVar11 = -uVar10 & (uVar11 + uVar10) - 1;
        if ((packing < BufferPackingScalarEnhancedLayout) && ((0x53U >> (packing & 0x1f) & 1) != 0))
        {
          if (uVar4 != uVar11) goto LAB_00121392;
LAB_001212db:
          bVar1 = Compiler::is_array(&this->super_Compiler,type_00);
          if (!bVar1) {
LAB_00121327:
            packing_00 = packing;
            if (uVar7 < 6 && (~(0x2bU >> ((byte)uVar7 & 0x1f)) & 1) == 0) {
              packing_00 = *(BufferPackingStandard *)(&DAT_002744cc + (ulong)uVar7 * 4);
            }
            if (((type_00->pointer != false) ||
                ((type_00->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size == 0))
               || (bVar1 = buffer_is_packing_standard
                                     (this,type_00,packing_00,(uint32_t *)0x0,0,0xffffffff), bVar1))
            goto LAB_0012127d;
            goto LAB_00121392;
          }
          uVar2 = type_to_packed_array_stride(this,type_00,&local_78,packing);
          uVar5 = Compiler::type_struct_member_array_stride(&this->super_Compiler,type,index);
          if (uVar2 == uVar5) goto LAB_00121327;
          if (failed_validation_index != (uint32_t *)0x0) {
            *failed_validation_index = index;
          }
        }
        else {
          if ((uVar10 - 1 & uVar4) == 0) goto LAB_001212db;
LAB_00121392:
          if (failed_validation_index != (uint32_t *)0x0) {
            *failed_validation_index = index;
          }
        }
        iVar9 = 1;
        goto LAB_001213a3;
      }
LAB_0012127d:
      uVar11 = uVar4 + uVar3;
      iVar9 = 0;
      bVar1 = true;
    }
    else {
      iVar9 = 2;
LAB_001213a3:
      bVar1 = false;
    }
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_78.higher._M_h);
    index = index + 1;
  } while (bVar1);
  return iVar9 == 2;
}

Assistant:

bool CompilerGLSL::buffer_is_packing_standard(const SPIRType &type, BufferPackingStandard packing,
                                              uint32_t *failed_validation_index, uint32_t start_offset,
                                              uint32_t end_offset)
{
	// This is very tricky and error prone, but try to be exhaustive and correct here.
	// SPIR-V doesn't directly say if we're using std430 or std140.
	// SPIR-V communicates this using Offset and ArrayStride decorations (which is what really matters),
	// so we have to try to infer whether or not the original GLSL source was std140 or std430 based on this information.
	// We do not have to consider shared or packed since these layouts are not allowed in Vulkan SPIR-V (they are useless anyways, and custom offsets would do the same thing).
	//
	// It is almost certain that we're using std430, but it gets tricky with arrays in particular.
	// We will assume std430, but infer std140 if we can prove the struct is not compliant with std430.
	//
	// The only two differences between std140 and std430 are related to padding alignment/array stride
	// in arrays and structs. In std140 they take minimum vec4 alignment.
	// std430 only removes the vec4 requirement.

	uint32_t offset = 0;
	uint32_t pad_alignment = 1;

	bool is_top_level_block =
	    has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

	for (uint32_t i = 0; i < type.member_types.size(); i++)
	{
		auto &memb_type = get<SPIRType>(type.member_types[i]);

		auto *type_meta = ir.find_meta(type.self);
		auto member_flags = type_meta ? type_meta->members[i].decoration_flags : Bitset{};

		// Verify alignment rules.
		uint32_t packed_alignment = type_to_packed_alignment(memb_type, member_flags, packing);

		// This is a rather dirty workaround to deal with some cases of OpSpecConstantOp used as array size, e.g:
		// layout(constant_id = 0) const int s = 10;
		// const int S = s + 5; // SpecConstantOp
		// buffer Foo { int data[S]; }; // <-- Very hard for us to deduce a fixed value here,
		// we would need full implementation of compile-time constant folding. :(
		// If we are the last member of a struct, there might be cases where the actual size of that member is irrelevant
		// for our analysis (e.g. unsized arrays).
		// This lets us simply ignore that there are spec constant op sized arrays in our buffers.
		// Querying size of this member will fail, so just don't call it unless we have to.
		//
		// This is likely "best effort" we can support without going into unacceptably complicated workarounds.
		bool member_can_be_unsized =
		    is_top_level_block && size_t(i + 1) == type.member_types.size() && !memb_type.array.empty();

		uint32_t packed_size = 0;
		if (!member_can_be_unsized || packing_is_hlsl(packing))
			packed_size = type_to_packed_size(memb_type, member_flags, packing);

		// We only need to care about this if we have non-array types which can straddle the vec4 boundary.
		uint32_t actual_offset = type_struct_member_offset(type, i);

		if (packing_is_hlsl(packing))
		{
			// If a member straddles across a vec4 boundary, alignment is actually vec4.
			uint32_t target_offset;

			// If we intend to use explicit packing, we must check for improper straddle with that offset.
			// In implicit packing, we must check with implicit offset, since the explicit offset
			// might have already accounted for the straddle, and we'd miss the alignment promotion to vec4.
			// This is important when packing sub-structs that don't support packoffset().
			if (packing_has_flexible_offset(packing))
				target_offset = actual_offset;
			else
				target_offset = offset;

			uint32_t begin_word = target_offset / 16;
			uint32_t end_word = (target_offset + packed_size - 1) / 16;

			if (begin_word != end_word)
				packed_alignment = max<uint32_t>(packed_alignment, 16u);
		}

		// Field is not in the specified range anymore and we can ignore any further fields.
		if (actual_offset >= end_offset)
			break;

		uint32_t alignment = max(packed_alignment, pad_alignment);
		offset = (offset + alignment - 1) & ~(alignment - 1);

		// The next member following a struct member is aligned to the base alignment of the struct that came before.
		// GL 4.5 spec, 7.6.2.2.
		if (memb_type.basetype == SPIRType::Struct && !memb_type.pointer)
			pad_alignment = packed_alignment;
		else
			pad_alignment = 1;

		// Only care about packing if we are in the given range
		if (actual_offset >= start_offset)
		{
			// We only care about offsets in std140, std430, etc ...
			// For EnhancedLayout variants, we have the flexibility to choose our own offsets.
			if (!packing_has_flexible_offset(packing))
			{
				if (actual_offset != offset) // This cannot be the packing we're looking for.
				{
					if (failed_validation_index)
						*failed_validation_index = i;
					return false;
				}
			}
			else if ((actual_offset & (alignment - 1)) != 0)
			{
				// We still need to verify that alignment rules are observed, even if we have explicit offset.
				if (failed_validation_index)
					*failed_validation_index = i;
				return false;
			}

			// Verify array stride rules.
			if (is_array(memb_type) &&
			    type_to_packed_array_stride(memb_type, member_flags, packing) !=
			    type_struct_member_array_stride(type, i))
			{
				if (failed_validation_index)
					*failed_validation_index = i;
				return false;
			}

			// Verify that sub-structs also follow packing rules.
			// We cannot use enhanced layouts on substructs, so they better be up to spec.
			auto substruct_packing = packing_to_substruct_packing(packing);

			if (!memb_type.pointer && !memb_type.member_types.empty() &&
			    !buffer_is_packing_standard(memb_type, substruct_packing))
			{
				if (failed_validation_index)
					*failed_validation_index = i;
				return false;
			}
		}

		// Bump size.
		offset = actual_offset + packed_size;
	}

	return true;
}